

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

baseHolder * __thiscall
cs_impl::any::holder<cni_root_namespace::foo_t>::duplicate(holder<cni_root_namespace::foo_t> *this)

{
  holder<cni_root_namespace::foo_t> *phVar1;
  foo_t *in_stack_00000008;
  allocator_type<cs_impl::any::holder<cni_root_namespace::foo_t>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_00000010;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<cni_root_namespace::foo_t>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cni_root_namespace::foo_t&>(in_stack_00000010,in_stack_00000008);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}